

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDVertex::MaximumEdgeFaceCount(ON_SubDVertex *this)

{
  ulong uVar1;
  ON_SubDEdge *e;
  unsigned_short vei;
  unsigned_short max_count;
  ON_SubDVertex *this_local;
  
  e._6_2_ = 0;
  for (e._4_2_ = 0; e._4_2_ < this->m_edge_count; e._4_2_ = e._4_2_ + 1) {
    uVar1 = this->m_edges[e._4_2_].m_ptr & 0xfffffffffffffff8;
    if ((uVar1 != 0) && (e._6_2_ < *(ushort *)(uVar1 + 100))) {
      e._6_2_ = *(ushort *)(uVar1 + 100);
    }
  }
  return (uint)e._6_2_;
}

Assistant:

unsigned int ON_SubDVertex::MaximumEdgeFaceCount() const
{
  unsigned short max_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr != e && e->m_face_count > max_count)
    max_count = e->m_face_count;
  }
  return max_count;
}